

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapic.cc
# Opt level: O2

void __thiscall rapic::scan::initialize_rays(scan *this)

{
  float *pfVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  header *phVar6;
  string *__lhs;
  runtime_error *this_00;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  float __tmp;
  int inc;
  
  lVar5 = get_header_integer(this,"STNID");
  this->station_id_ = (int)lVar5;
  phVar6 = find_header(this,"VOLUMEID");
  if (phVar6 != (header *)0x0) {
    lVar5 = header::get_integer(phVar6);
    this->volume_id_ = (int)lVar5;
  }
  get_header_string_abi_cxx11_(this,"PRODUCT");
  std::__cxx11::string::_M_assign((string *)&this->product_);
  phVar6 = find_header(this,"PASS");
  if ((phVar6 == (header *)0x0) ||
     (iVar4 = __isoc99_sscanf((phVar6->value_)._M_dataplus._M_p,"%d of %d",&this->pass_,
                              &this->pass_count_), iVar4 == 2)) {
    __lhs = get_header_string_abi_cxx11_(this,"IMGFMT");
    bVar3 = std::operator==(__lhs,"RHI");
    this->is_rhi_ = bVar3;
    dVar8 = get_header_real(this,"ANGRES");
    this->angle_resolution_ = (float)dVar8;
    dVar8 = get_header_real(this,"RNGRES");
    dVar9 = get_header_real(this,"STARTRNG");
    dVar10 = get_header_real(this,"ENDRNG");
    pfVar1 = &this->angle_max_;
    iVar4 = __isoc99_sscanf((this->product_)._M_dataplus._M_p,
                            "%*s %*s SECTOR ANGLE1=%f ANGLE2=%f ANGLEINCREASING=%d",
                            &this->angle_min_,pfVar1);
    if (iVar4 == 3) {
      fVar2 = this->angle_min_;
      fVar7 = *pfVar1;
      while (fVar7 <= fVar2) {
        fVar7 = fVar7 + 360.0;
        *pfVar1 = fVar7;
      }
      fVar7 = fVar7 - fVar2;
    }
    else {
      this->angle_min_ = 0.0;
      this->angle_max_ = 360.0;
      fVar7 = 360.0;
    }
    lVar5 = lroundf(fVar7 / this->angle_resolution_);
    this->rays_ = (int)lVar5;
    dVar11 = remainder((double)(this->angle_max_ - this->angle_min_),(double)this->angle_resolution_
                      );
    if (0.001 < dVar11) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"ANGRES is not a factor of sweep length");
    }
    else {
      lVar5 = lround((dVar10 - dVar9) / dVar8);
      this->bins_ = (int)lVar5;
      if ((-1 < (int)lVar5) && (dVar8 = remainder(dVar10 - dVar9,dVar8), dVar8 <= 0.001)) {
        std::vector<rapic::ray_header,_std::allocator<rapic::ray_header>_>::reserve
                  (&this->ray_headers_,(long)this->rays_);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this->level_data_,(long)this->bins_ * (long)this->rays_);
        return;
      }
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"RNGRES is not a factor of range span");
    }
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"invalid PASS header");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto scan::initialize_rays() -> void
{
  // if this is our first ray, setup the data array

  // store the header fields which we cache
  station_id_ = get_header_integer("STNID");
  if (auto p = find_header("VOLUMEID"))
    volume_id_ = p->get_integer();
  product_ = get_header_string("PRODUCT");
  if (auto p = find_header("PASS"))
  {
    if (sscanf(p->value().c_str(), "%d of %d", &pass_, &pass_count_) != 2)
      throw std::runtime_error{"invalid PASS header"};
  }
  is_rhi_ = get_header_string("IMGFMT") == "RHI";

  // get the mandatory characteristics needed to determine scan structure
  angle_resolution_ = get_header_real("ANGRES");
  double rngres = get_header_real("RNGRES");
  double startrng = get_header_real("STARTRNG");
  double endrng = get_header_real("ENDRNG");

  // if start/end angles are provided, use them to limit our ray count
  int inc = 1;
  if (sscanf(product_.c_str(), "%*s %*s SECTOR ANGLE1=%f ANGLE2=%f ANGLEINCREASING=%d", &angle_min_, &angle_max_, &inc) == 3)
  {
    if (inc == 0)
      std::swap(angle_min_, angle_max_);
    while (angle_max_ <= angle_min_)
      angle_max_ += 360.0;
  }
  else
  {
    angle_min_ = 0.0f;
    angle_max_ = 360.0f;
  }

  rays_ = std::lround((angle_max_ - angle_min_) / angle_resolution_);
  if (remainder(angle_max_ - angle_min_, angle_resolution_) > 0.001)
    throw std::runtime_error{"ANGRES is not a factor of sweep length"};

  bins_ = std::lround((endrng - startrng) / rngres);
  if (bins_ < 0 || remainder(endrng - startrng, rngres) > 0.001)
    throw std::runtime_error("RNGRES is not a factor of range span");

  ray_headers_.reserve(rays_);
  level_data_.resize(rays_ * bins_);
}